

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  sVar5 = s->_M_string_length;
  pcVar1 = pcVar3 + sVar5;
  pcVar4 = pcVar3;
  while (((sVar5 != 0 && (pcVar4 = pcVar3, -1 < *pcVar3)) &&
         (iVar2 = isspace((int)*pcVar3), iVar2 != 0))) {
    pcVar3 = pcVar3 + 1;
    sVar5 = sVar5 - 1;
    pcVar4 = pcVar1;
  }
  if (pcVar4 == pcVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    do {
      pcVar3 = pcVar1;
      if (pcVar3[-1] < '\0') break;
      iVar2 = isspace((int)pcVar3[-1]);
      pcVar1 = pcVar3 + -1;
    } while (iVar2 != 0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while (start != s.end() && cm_isspace(*start))
    ++start;
  if (start == s.end())
    return "";

  std::string::const_iterator stop = s.end()-1;
  while (cm_isspace(*stop))
    --stop;
  return std::string(start, stop+1);
}